

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O3

int __thiscall Fossilize::Device::init(Device *this,EVP_PKEY_CTX *ctx)

{
  int *piVar1;
  VkLayerInstanceDispatchTable *pVVar2;
  StateRecorder *pSVar3;
  PFN_vkGetPhysicalDeviceProperties2 p_Var4;
  Instance *in_RCX;
  VkDevice in_RDX;
  int *piVar5;
  int *in_R8;
  VkLayerDispatchTable *in_R9;
  VkPhysicalDeviceShaderModuleIdentifierPropertiesEXT identifierProps;
  VkPhysicalDeviceProperties2 props2;
  undefined4 local_398;
  undefined4 uStack_394;
  undefined4 uStack_390;
  undefined4 uStack_38c;
  undefined8 local_388;
  undefined8 uStack_380;
  VkPhysicalDeviceProperties2 local_378;
  
  this->gpu = (VkPhysicalDevice)ctx;
  this->device = in_RDX;
  this->pInstance = in_RCX;
  pVVar2 = in_RCX->pTable;
  this->pInstanceTable = pVVar2;
  this->pTable = in_R9;
  piVar5 = in_R8;
  if (in_R8 != (int *)0x0) {
    do {
      if (*piVar5 == 0x3ba1d6b0) {
        memset(&local_378,0,0x348);
        local_378.sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PROPERTIES_2;
        local_388 = 0;
        uStack_380 = 0;
        local_398 = 0x3ba1d6b1;
        uStack_394 = 0;
        uStack_390 = 0;
        uStack_38c = 0;
        if (piVar5[4] == 0) goto LAB_0011467e;
        p_Var4 = pVVar2->GetPhysicalDeviceProperties2;
        if ((p_Var4 == (PFN_vkGetPhysicalDeviceProperties2)0x0) &&
           (p_Var4 = pVVar2->GetPhysicalDeviceProperties2KHR,
           p_Var4 == (PFN_vkGetPhysicalDeviceProperties2)0x0)) {
          local_378.pNext = &local_398;
          (*pVVar2->GetPhysicalDeviceProperties)((VkPhysicalDevice)ctx,&local_378.properties);
        }
        else {
          local_378.pNext = &local_398;
          (*p_Var4)((VkPhysicalDevice)ctx,&local_378);
        }
        this->usesModuleIdentifiers = true;
        goto LAB_0011468a;
      }
      piVar1 = piVar5 + 2;
      piVar5 = *(int **)piVar1;
    } while (*(int **)piVar1 != (int *)0x0);
  }
  memset(&local_378,0,0x348);
LAB_0011467e:
  uStack_380 = 0;
  local_388 = 0;
  uStack_38c = 0;
  uStack_390 = 0;
  uStack_394 = 0;
  local_398 = 0x3ba1d6b1;
  local_378.sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PROPERTIES_2;
  (*pVVar2->GetPhysicalDeviceProperties)((VkPhysicalDevice)ctx,&local_378.properties);
LAB_0011468a:
  pSVar3 = Instance::getStateRecorderForDevice
                     (this->pInstance,&local_378,this->pInstance->pAppInfo,in_R8);
  this->recorder = pSVar3;
  return (int)pSVar3;
}

Assistant:

void Device::init(VkPhysicalDevice gpu_, VkDevice device_, Instance *pInstance_,
                  const void *device_pnext,
                  VkLayerDispatchTable *pTable_)
{
	gpu = gpu_;
	device = device_;
	pInstance = pInstance_;
	pInstanceTable = pInstance->getTable();
	pTable = pTable_;

	// Need to know the UUID hash, so we can write module identifiers to appropriate path.
	auto *identifier =
			static_cast<const VkPhysicalDeviceShaderModuleIdentifierFeaturesEXT *>(
					findpNext(device_pnext,
					          VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_MODULE_IDENTIFIER_FEATURES_EXT));

	VkPhysicalDeviceProperties2 props2 = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PROPERTIES_2 };
	VkPhysicalDeviceShaderModuleIdentifierPropertiesEXT identifierProps =
			{ VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_SHADER_MODULE_IDENTIFIER_PROPERTIES_EXT };

	// Only bother if the application is actually using shader module identifiers.
	if (identifier && identifier->shaderModuleIdentifier)
	{
		props2.pNext = &identifierProps;
		if (pInstanceTable->GetPhysicalDeviceProperties2)
			pInstanceTable->GetPhysicalDeviceProperties2(gpu, &props2);
		else if (pInstanceTable->GetPhysicalDeviceProperties2KHR)
			pInstanceTable->GetPhysicalDeviceProperties2KHR(gpu, &props2);
		else
			pInstanceTable->GetPhysicalDeviceProperties(gpu, &props2.properties);

		usesModuleIdentifiers = true;
	}
	else
	{
		pInstanceTable->GetPhysicalDeviceProperties(gpu, &props2.properties);
	}

	recorder = pInstance->getStateRecorderForDevice(&props2, pInstance->getApplicationInfo(), device_pnext);
}